

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::Postprocess_BuildLight
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,
          list<aiLight_*,_std::allocator<aiLight_*>_> *pSceneLightList)

{
  EType EVar1;
  undefined8 uVar2;
  aiLight *this_00;
  DeadlyImportError *this_01;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  aiColor3D local_94;
  aiColor3D local_88;
  aiColor3D local_7c;
  aiLight *local_70;
  aiLight *new_light;
  aiMatrix4x4 transform_matr;
  CX3DImporter_NodeElement_Light *ne;
  list<aiLight_*,_std::allocator<aiLight_*>_> *pSceneLightList_local;
  CX3DImporter_NodeElement *pNodeElement_local;
  X3DImporter *this_local;
  
  transform_matr._56_8_ = pNodeElement;
  PostprocessHelper_Matrix_GlobalToCurrent((aiMatrix4x4 *)&new_light,this);
  this_00 = (aiLight *)operator_new(0x46c);
  aiLight::aiLight(this_00);
  local_70 = this_00;
  aiString::operator=((aiString *)this_00,(string *)(transform_matr._56_8_ + 0x10));
  aiColor3D::operator*(&local_7c,*(ai_real *)(transform_matr._56_8_ + 0x50));
  aiColor3D::operator=(&local_70->mColorAmbient,&local_7c);
  aiColor3D::operator*(&local_88,*(ai_real *)(transform_matr._56_8_ + 0x70));
  aiColor3D::operator=(&local_70->mColorDiffuse,&local_88);
  aiColor3D::operator*(&local_94,*(ai_real *)(transform_matr._56_8_ + 0x70));
  aiColor3D::operator=(&local_70->mColorSpecular,&local_94);
  EVar1 = pNodeElement->Type;
  if (EVar1 == ENET_DirectionalLight) {
    local_70->mType = aiLightSource_DIRECTIONAL;
    uVar2 = *(undefined8 *)(transform_matr._56_8_ + 0x60);
    (local_70->mDirection).x = (float)(int)uVar2;
    (local_70->mDirection).y = (float)(int)((ulong)uVar2 >> 0x20);
    (local_70->mDirection).z = *(float *)(transform_matr._56_8_ + 0x68);
    aiVector3t<float>::operator*=(&local_70->mDirection,(aiMatrix4x4t<float> *)&new_light);
  }
  else if (EVar1 == ENET_PointLight) {
    local_70->mType = aiLightSource_POINT;
    uVar2 = *(undefined8 *)(transform_matr._56_8_ + 0x80);
    (local_70->mPosition).x = (float)(int)uVar2;
    (local_70->mPosition).y = (float)(int)((ulong)uVar2 >> 0x20);
    (local_70->mPosition).z = *(float *)(transform_matr._56_8_ + 0x88);
    aiVector3t<float>::operator*=(&local_70->mPosition,(aiMatrix4x4t<float> *)&new_light);
    local_70->mAttenuationConstant = *(float *)(transform_matr._56_8_ + 0x74);
    local_70->mAttenuationLinear = *(float *)(transform_matr._56_8_ + 0x78);
    local_70->mAttenuationQuadratic = *(float *)(transform_matr._56_8_ + 0x7c);
  }
  else {
    if (EVar1 != ENET_SpotLight) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      to_string<CX3DImporter_NodeElement::EType>(&local_f8,pNodeElement->Type);
      std::operator+(&local_d8,"Postprocess_BuildLight. Unknown type of light: ",&local_f8);
      std::operator+(&local_b8,&local_d8,".");
      DeadlyImportError::DeadlyImportError(this_01,&local_b8);
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    local_70->mType = aiLightSource_SPOT;
    uVar2 = *(undefined8 *)(transform_matr._56_8_ + 0x80);
    (local_70->mPosition).x = (float)(int)uVar2;
    (local_70->mPosition).y = (float)(int)((ulong)uVar2 >> 0x20);
    (local_70->mPosition).z = *(float *)(transform_matr._56_8_ + 0x88);
    aiVector3t<float>::operator*=(&local_70->mPosition,(aiMatrix4x4t<float> *)&new_light);
    uVar2 = *(undefined8 *)(transform_matr._56_8_ + 0x60);
    (local_70->mDirection).x = (float)(int)uVar2;
    (local_70->mDirection).y = (float)(int)((ulong)uVar2 >> 0x20);
    (local_70->mDirection).z = *(float *)(transform_matr._56_8_ + 0x68);
    aiVector3t<float>::operator*=(&local_70->mDirection,(aiMatrix4x4t<float> *)&new_light);
    local_70->mAttenuationConstant = *(float *)(transform_matr._56_8_ + 0x74);
    local_70->mAttenuationLinear = *(float *)(transform_matr._56_8_ + 0x78);
    local_70->mAttenuationQuadratic = *(float *)(transform_matr._56_8_ + 0x7c);
    local_70->mAngleInnerCone = *(float *)(transform_matr._56_8_ + 0x90);
    local_70->mAngleOuterCone = *(float *)(transform_matr._56_8_ + 0x94);
  }
  std::__cxx11::list<aiLight_*,_std::allocator<aiLight_*>_>::push_back(pSceneLightList,&local_70);
  return;
}

Assistant:

void X3DImporter::Postprocess_BuildLight(const CX3DImporter_NodeElement& pNodeElement, std::list<aiLight*>& pSceneLightList) const
{
    const CX3DImporter_NodeElement_Light& ne = *( ( CX3DImporter_NodeElement_Light* ) &pNodeElement );
    aiMatrix4x4 transform_matr = PostprocessHelper_Matrix_GlobalToCurrent();
    aiLight* new_light = new aiLight;

	new_light->mName = ne.ID;
	new_light->mColorAmbient = ne.Color * ne.AmbientIntensity;
	new_light->mColorDiffuse = ne.Color * ne.Intensity;
	new_light->mColorSpecular = ne.Color * ne.Intensity;
	switch(pNodeElement.Type)
	{
		case CX3DImporter_NodeElement::ENET_DirectionalLight:
			new_light->mType = aiLightSource_DIRECTIONAL;
			new_light->mDirection = ne.Direction, new_light->mDirection *= transform_matr;

			break;
		case CX3DImporter_NodeElement::ENET_PointLight:
			new_light->mType = aiLightSource_POINT;
			new_light->mPosition = ne.Location, new_light->mPosition *= transform_matr;
			new_light->mAttenuationConstant = ne.Attenuation.x;
			new_light->mAttenuationLinear = ne.Attenuation.y;
			new_light->mAttenuationQuadratic = ne.Attenuation.z;

			break;
		case CX3DImporter_NodeElement::ENET_SpotLight:
			new_light->mType = aiLightSource_SPOT;
			new_light->mPosition = ne.Location, new_light->mPosition *= transform_matr;
			new_light->mDirection = ne.Direction, new_light->mDirection *= transform_matr;
			new_light->mAttenuationConstant = ne.Attenuation.x;
			new_light->mAttenuationLinear = ne.Attenuation.y;
			new_light->mAttenuationQuadratic = ne.Attenuation.z;
			new_light->mAngleInnerCone = ne.BeamWidth;
			new_light->mAngleOuterCone = ne.CutOffAngle;

			break;
		default:
			throw DeadlyImportError("Postprocess_BuildLight. Unknown type of light: " + to_string(pNodeElement.Type) + ".");
	}

	pSceneLightList.push_back(new_light);
}